

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O2

void ImTui_ImplNcurses_DrawScreen(bool active)

{
  int *piVar1;
  int *piVar2;
  uint pnx;
  uint pny;
  uint uVar3;
  uint64_t uVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  VSync *pVVar13;
  uchar uVar14;
  long lVar15;
  long lVar16;
  undefined7 in_register_00000039;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 local_88 [80];
  duration<long,_std::ratio<1L,_1000000L>_> local_38;
  ulong uVar22;
  
  if ((int)CONCAT71(in_register_00000039,active) != 0) {
    nActiveFrames = 10;
  }
  wrefresh(_stdscr);
  pnx = g_screen->nx;
  lVar15 = (long)(int)pnx;
  pny = g_screen->ny;
  bVar6 = screenPrev.ny == pny;
  bVar7 = screenPrev.nx == pnx;
  if (!bVar6 || !bVar7) {
    ImTui::TScreen::resize(&screenPrev,pnx,pny);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&curs,lVar15 + 1);
  lVar18 = 0;
  uVar10 = 0;
  if (0 < (int)pnx) {
    uVar10 = (ulong)pnx;
  }
  uVar11 = 0;
  if (0 < (int)pny) {
    uVar11 = (ulong)pny;
  }
  auVar8._12_4_ = 0;
  auVar8._0_12_ = local_88._4_12_;
  local_88._0_16_ = auVar8 << 0x20;
  for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
    lVar16 = lVar18;
    uVar19 = uVar10;
    if (bVar6 && bVar7) {
      do {
        if (uVar19 == 0) goto LAB_0010e121;
        piVar1 = (int *)((long)screenPrev.data + lVar16);
        piVar2 = (int *)((long)g_screen->data + lVar16);
        lVar16 = lVar16 + 4;
        uVar19 = uVar19 - 1;
      } while (*piVar1 == *piVar2);
    }
    lVar23 = uVar17 * lVar15;
    move(uVar17,0);
    lVar16 = lVar23;
    uVar19 = uVar10;
    uVar24 = 0xffffffffffffffff;
    iVar20 = local_88._0_4_;
    while( true ) {
      bVar25 = uVar19 == 0;
      uVar19 = uVar19 - 1;
      if (bVar25) break;
      uVar3 = g_screen->data[lVar16];
      uVar21 = uVar3 >> 0x10 & 0xff | (uVar3 >> 0x18) << 8;
      uVar22 = (ulong)uVar21;
      if (colPairs._M_elems[uVar22].first == false) {
        local_88._0_4_ = iVar20;
        init_pair((int)(short)nColPairs,uVar3 >> 0x10 & 0xff);
        colPairs._M_elems[uVar22].first = true;
        colPairs._M_elems[uVar22].second = nColPairs;
        nColPairs = nColPairs + 1;
      }
      if ((uint)uVar24 == uVar21) {
        uVar22 = uVar24 & 0xffffffff;
      }
      else {
        local_88._0_8_ = lVar16;
        if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar20] = '\0';
          waddnstr(_stdscr,curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,0xffffffffffffffff);
          iVar20 = 0;
          *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = '\0';
        }
        wattr_on(_stdscr,(colPairs._M_elems[uVar22].second & 0xffU) << 8,0);
      }
      uVar14 = (uchar)uVar3;
      if ((short)uVar3 == 0) {
        uVar14 = '.';
      }
      lVar12 = (long)iVar20;
      iVar20 = iVar20 + 1;
      curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] = uVar14;
      lVar16 = lVar16 + 1;
      uVar24 = uVar22;
    }
    if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar20] = '\0';
      waddnstr(_stdscr,curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0xffffffffffffffff);
      iVar20 = 0;
      *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = '\0';
    }
    local_88._0_4_ = iVar20;
    if (bVar6 && bVar7) {
      memcpy(screenPrev.data + lVar23,g_screen->data + lVar23,lVar15 * 4);
    }
LAB_0010e121:
    lVar18 = lVar18 + lVar15 * 4;
  }
  if (!bVar6 || !bVar7) {
    memcpy(screenPrev.data,g_screen->data,(long)(int)(pny * pnx) << 2);
  }
  iVar20 = nActiveFrames;
  nActiveFrames = nActiveFrames + -1;
  lVar15 = std::chrono::_V2::system_clock::now();
  uVar9 = g_vsync.tNext_us;
  pVVar13 = (VSync *)&g_vsync.tStepIdle_us;
  if (0 < iVar20) {
    pVVar13 = &g_vsync;
  }
  uVar4 = pVVar13->tStepActive_us;
  lVar18 = g_vsync.tNext_us + uVar4;
  wtimeout(_stdscr,0);
  auVar27._8_4_ = (int)((ulong)lVar18 >> 0x20);
  auVar27._0_8_ = lVar18;
  auVar27._12_4_ = 0x45300000;
  do {
    uVar10 = lVar15 / 1000;
    if ((uVar9 + uVar4) - 100 <= uVar10) {
      g_vsync.tNext_us = g_vsync.tNext_us + uVar4;
LAB_0010e326:
      wtimeout(_stdscr,1);
      return;
    }
    auVar28._8_4_ = (int)(uVar10 >> 0x20);
    auVar28._0_8_ = uVar10;
    auVar28._12_4_ = 0x45300000;
    auVar30._8_4_ = (int)(g_vsync.tStepActive_us >> 0x20);
    auVar30._0_8_ = g_vsync.tStepActive_us;
    auVar30._12_4_ = 0x45300000;
    dVar26 = (auVar30._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)g_vsync.tStepActive_us) - 4503599627370496.0);
    if (dVar26 * 0.5 +
        (auVar28._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0) <
        (auVar27._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) {
      iVar20 = wgetch(_stdscr);
      if (iVar20 != -1) {
        ungetch(iVar20);
        goto LAB_0010e326;
      }
      dVar26 = ((double)CONCAT44(0x45300000,(int)(g_vsync.tStepActive_us >> 0x20)) -
               1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)g_vsync.tStepActive_us) - 4503599627370496.0);
    }
    uVar11 = (ulong)(dVar26 * 0.9);
    lVar15 = lVar18 - uVar10;
    auVar29._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar29._0_8_ = lVar15;
    auVar29._12_4_ = 0x45300000;
    dVar5 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) * 0.9;
    uVar10 = (ulong)dVar5;
    uVar11 = (long)(dVar26 * 0.9 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
    local_38.__r = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    if (uVar11 <= (ulong)local_38.__r) {
      local_38.__r = uVar11;
    }
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_38);
    lVar15 = std::chrono::_V2::system_clock::now();
  } while( true );
}

Assistant:

void ImTui_ImplNcurses_DrawScreen(bool active) {
    if (active) nActiveFrames = 10;

    wrefresh(stdscr);

    int nx = g_screen->nx;
    int ny = g_screen->ny;

    bool compare = true;

    if (screenPrev.nx != nx || screenPrev.ny != ny) {
        screenPrev.resize(nx, ny);
        compare = false;
    }

    int ic = 0;
    curs.resize(nx + 1);

    for (int y = 0; y < ny; ++y) {
        bool isSame = compare;
        if (compare) {
            for (int x = 0; x < nx; ++x) {
                if (screenPrev.data[y*nx + x] != g_screen->data[y*nx + x]) {
                    isSame = false;
                    break;
                }
            }
        }
        if (isSame) continue;

        int lastp = 0xFFFFFFFF;
        move(y, 0);
        for (int x = 0; x < nx; ++x) {
            auto cell = g_screen->data[y*nx + x];
            uint16_t f = (cell & 0x00FF0000) >> 16;
            uint16_t b = (cell & 0xFF000000) >> 24;
            uint16_t p = b*256 + f;

            if (colPairs[p].first == false) {
                init_pair(nColPairs, f, b);
                colPairs[p].first = true;
                colPairs[p].second = nColPairs;
                ++nColPairs;
            }

            if (lastp != (int) p) {
                if (curs.size() > 0) {
                    curs[ic] = 0;
                    addstr((char *) curs.data());
                    ic = 0;
                    curs[0] = 0;
                }
                attron(COLOR_PAIR(colPairs[p].second));
                lastp = p;
            }

            uint16_t c = cell & 0x0000FFFF;
            curs[ic++] = c > 0 ? c : '.';
        }

        if (curs.size() > 0) {
            curs[ic] = 0;
            addstr((char *) curs.data());
            ic = 0;
            curs[0] = 0;
        }

        if (compare) {
            memcpy(screenPrev.data + y*nx, g_screen->data + y*nx, nx*sizeof(ImTui::TCell));
        }
    }

    if (!compare) {
        memcpy(screenPrev.data, g_screen->data, nx*ny*sizeof(ImTui::TCell));
    }

    g_vsync.wait(nActiveFrames --> 0);
}